

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O1

Pdr_Set_t * Pdr_ManReduceClause(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Pdr_Set_t *pCube_00;
  ulong uVar8;
  
  if ((k < 0) || (p->vSolvers->nSize <= k)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar4 = p->vSolvers->pArray[(uint)k];
  pVVar6 = Pdr_ManLitsToCube(p,k,*(int **)((long)pvVar4 + 0x138),*(int *)((long)pvVar4 + 0x134));
  uVar1 = pVVar6->nSize;
  uVar2 = pCube->nLits;
  if (uVar1 == uVar2) {
    pCube_00 = (Pdr_Set_t *)0x0;
  }
  else {
    if ((int)uVar2 <= (int)uVar1) {
      __assert_fail("Vec_IntSize(vLits) < pCube->nLits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                    ,0x5e,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
    }
    if ((int)uVar1 < 1) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        if ((*(byte *)(pVVar6->pArray + uVar8) & 1) == 0) goto LAB_00549df6;
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
      uVar8 = (ulong)uVar1;
    }
LAB_00549df6:
    if ((uint)uVar8 == uVar1) {
      uVar8 = 0;
      if (0 < (int)uVar2) {
        do {
          uVar3 = *(uint *)(&pCube->field_0x14 + uVar8 * 4);
          if ((uVar3 & 1) == 0) {
            uVar2 = pVVar6->nCap;
            if (uVar1 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (pVVar6->pArray == (int *)0x0) {
                  piVar7 = (int *)malloc(0x40);
                }
                else {
                  piVar7 = (int *)realloc(pVVar6->pArray,0x40);
                }
                pVVar6->pArray = piVar7;
                iVar5 = 0x10;
              }
              else {
                iVar5 = uVar2 * 2;
                if (iVar5 <= (int)uVar2) goto LAB_00549e97;
                if (pVVar6->pArray == (int *)0x0) {
                  piVar7 = (int *)malloc((ulong)uVar2 << 3);
                }
                else {
                  piVar7 = (int *)realloc(pVVar6->pArray,(ulong)uVar2 << 3);
                }
                pVVar6->pArray = piVar7;
              }
              if (piVar7 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar6->nCap = iVar5;
            }
LAB_00549e97:
            iVar5 = pVVar6->nSize;
            pVVar6->nSize = iVar5 + 1;
            pVVar6->pArray[iVar5] = uVar3;
            goto LAB_00549ea9;
          }
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
        uVar8 = (ulong)uVar2;
      }
LAB_00549ea9:
      if (pCube->nLits <= (int)uVar8) {
        __assert_fail("i < pCube->nLits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                      ,0x6c,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
      }
    }
    pCube_00 = Pdr_SetCreateSubset(pCube,pVVar6->pArray,pVVar6->nSize);
    iVar5 = Pdr_SetIsInit(pCube_00,-1);
    if (iVar5 != 0) {
      __assert_fail("!Pdr_SetIsInit(pCubeMin, -1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCore.c"
                    ,0x70,"Pdr_Set_t *Pdr_ManReduceClause(Pdr_Man_t *, int, Pdr_Set_t *)");
    }
  }
  return pCube_00;
}

Assistant:

Pdr_Set_t * Pdr_ManReduceClause( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pCubeMin;
    Vec_Int_t * vLits;
    int i, Entry, nCoreLits, * pCoreLits;
    // get relevant SAT literals
    nCoreLits = sat_solver_final(Pdr_ManSolver(p, k), &pCoreLits);
    // translate them into register literals and remove auxiliary
    vLits = Pdr_ManLitsToCube( p, k, pCoreLits, nCoreLits );
    // skip if there is no improvement
    if ( Vec_IntSize(vLits) == pCube->nLits )
        return NULL;
    assert( Vec_IntSize(vLits) < pCube->nLits );
    // if the cube overlaps with init, add any literal
    Vec_IntForEachEntry( vLits, Entry, i )
        if ( lit_sign(Entry) == 0 ) // positive literal
            break;
    if ( i == Vec_IntSize(vLits) ) // only negative literals
    {
        // add the first positive literal
        for ( i = 0; i < pCube->nLits; i++ )
            if ( lit_sign(pCube->Lits[i]) == 0 ) // positive literal
            {
                Vec_IntPush( vLits, pCube->Lits[i] );
                break;
            }
        assert( i < pCube->nLits );
    }
    // generate a starting cube
    pCubeMin  = Pdr_SetCreateSubset( pCube, Vec_IntArray(vLits), Vec_IntSize(vLits) );
    assert( !Pdr_SetIsInit(pCubeMin, -1) );
/*
    // make sure the cube works
    {
    int RetValue;
    RetValue = Pdr_ManCheckCube( p, k, pCubeMin, NULL, 0 );
    assert( RetValue );
    }
*/
    return pCubeMin;
}